

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
mul_by_limb(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,limb_type v)

{
  iterator pvVar1;
  iterator last;
  const_iterator a;
  limb_type v_local;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  if (v == 0) {
    pvVar1 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    last = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                     ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(pvVar1,last,0);
  }
  else if (1 < v) {
    pvVar1 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    a = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::cbegin
                  ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
    eval_multiply_1d<unsigned_int*,unsigned_int_const*>(pvVar1,a,v,0x40);
  }
  return this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }